

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::keys_function::evaluate
          (keys_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this_00;
  bool bVar2;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this_01;
  reference pbVar3;
  assertion_error *this_02;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *item;
  allocator<char> local_51;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_02 = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,"assertion \'args.size() == *this->arity()\' failed at  <> :0",
               &local_51);
    assertion_error::assertion_error(this_02,(string *)local_50);
    __cxa_throw(this_02,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (ppVar1->type_ == value) {
    this_00 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
              (ppVar1->field_1).value_;
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )this_00);
    if (bVar2) {
      this_01 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                ::create_json<jsoncons::json_array_arg_t_const&>
                          ((eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                            *)context,(json_array_arg_t *)&json_array_arg);
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::reserve
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 this_01,(long)(args->
                               super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(args->
                               super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 4);
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      object_range_abi_cxx11_((const_object_range_type *)local_50,this_00);
      while( true ) {
        bVar2 = local_50[8] == (bool)local_40._M_local_buf[8];
        if ((local_50[8] & local_40._M_local_buf[8] & 1U) != 0) {
          bVar2 = local_50._0_8_ == local_40._M_allocated_capacity;
        }
        if (bVar2) break;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        emplace_back<std::__cxx11::string_const&>
                  (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_50._0_8_);
        local_50._0_8_ = local_50._0_8_ + 0x30;
      }
      return (reference)this_01;
    }
  }
  std::error_code::operator=(ec,invalid_type);
  pbVar3 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar3;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                if (!arg0.is_object())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                auto result = context.create_json(json_array_arg);
                result->reserve(args.size());

                for (auto& item : arg0.object_range())
                {
                    result->emplace_back(item.key());
                }
                return *result;
            }